

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O1

void cfl_subsample_hbd_444_16x4_ssse3(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  ulong uVar1;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  
  pauVar2 = (undefined1 (*) [16])(cfl_type + 8);
  uVar1 = 0xffffffffffffffc0;
  do {
    auVar3 = psllw(pauVar2[-1],3);
    *(undefined1 (*) [16])((long)output_q3 + uVar1 + 0x40) = auVar3;
    auVar3 = psllw(*pauVar2,3);
    *(undefined1 (*) [16])((long)output_q3 + uVar1 + 0x50) = auVar3;
    uVar1 = uVar1 + 0x40;
    pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)input_stride * 2);
  } while (uVar1 < 0xc0);
  return;
}

Assistant:

CFL_GET_SUBSAMPLE_FUNCTION(ssse3)

static inline __m128i predict_unclipped(const __m128i *input, __m128i alpha_q12,
                                        __m128i alpha_sign, __m128i dc_q0) {
  __m128i ac_q3 = _mm_loadu_si128(input);
  __m128i ac_sign = _mm_sign_epi16(alpha_sign, ac_q3);
  __m128i scaled_luma_q0 = _mm_mulhrs_epi16(_mm_abs_epi16(ac_q3), alpha_q12);
  scaled_luma_q0 = _mm_sign_epi16(scaled_luma_q0, ac_sign);
  return _mm_add_epi16(scaled_luma_q0, dc_q0);
}